

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::forestUpdate(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int p_col,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *p_work,int num,int *nonz)

{
  int iVar1;
  bool bVar2;
  type_conflict5 tVar3;
  element_type *peVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  undefined8 uVar6;
  string *m_00;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  int iVar7;
  undefined4 *in_RDI;
  int *in_R8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  int jj;
  int dim;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  l_maxabs;
  int *corig;
  int *cperm;
  int *rorig;
  int *rperm;
  int *rbeg;
  int *rlen;
  int *rmax;
  int *ridx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rval;
  int *cbeg;
  int *clen;
  int *cmax;
  int *cidx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *cval;
  int *lbeg;
  int *lidx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *lval;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int rowno;
  int r;
  int c;
  int ll;
  int n;
  int m;
  int h;
  int k;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffeec8;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffeed0;
  allocator *paVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffeed8;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffeee0;
  self_type *in_stack_ffffffffffffeee8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeef0;
  undefined8 local_10f8;
  allocator local_10d9;
  string local_10d8 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffef38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffef40;
  int local_10b4;
  double in_stack_ffffffffffffef50;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffef58;
  undefined8 local_1078;
  undefined1 local_1070 [56];
  undefined1 local_1038 [32];
  int in_stack_ffffffffffffefe8;
  int in_stack_ffffffffffffefec;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeff0;
  undefined1 local_1000 [112];
  undefined8 local_f90;
  undefined8 local_f88;
  undefined8 local_f80;
  int local_f78;
  undefined1 local_f74 [58];
  undefined1 local_f3a;
  allocator local_f39;
  int in_stack_fffffffffffff0c8;
  int in_stack_fffffffffffff0cc;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff0d0;
  undefined1 local_f10 [56];
  undefined1 local_ed8 [56];
  undefined1 local_ea0 [56];
  undefined1 local_e68 [112];
  undefined8 local_df8;
  undefined1 local_df0 [56];
  undefined8 local_db8;
  undefined8 local_db0;
  undefined1 local_da8 [56];
  undefined1 local_d70 [56];
  undefined1 local_d38 [112];
  undefined8 local_cc8;
  undefined8 local_cc0;
  int local_cb4;
  undefined1 local_cb0 [59];
  undefined1 local_c75;
  allocator local_c61;
  string local_c60 [36];
  undefined4 local_c3c;
  undefined8 local_c38;
  undefined1 local_c30 [56];
  undefined1 local_bf8 [56];
  undefined4 local_bc0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bbc;
  int local_b84;
  undefined1 local_b80 [56];
  undefined1 local_b48 [56];
  undefined1 local_b10 [112];
  undefined8 local_aa0;
  undefined1 local_a98 [56];
  undefined1 local_a60 [56];
  undefined1 local_a28 [56];
  undefined1 local_9f0 [112];
  Real local_980;
  undefined1 local_978 [56];
  undefined1 local_940 [56];
  undefined8 local_908;
  undefined1 local_900 [56];
  undefined1 local_8c8 [56];
  undefined1 local_890 [112];
  Real local_820;
  undefined1 local_818 [56];
  undefined1 local_7e0 [56];
  undefined8 local_7a8;
  int local_79c;
  undefined1 local_798 [56];
  long local_760;
  long local_758;
  long local_750;
  long local_748;
  long local_740;
  long local_738;
  long local_730;
  long local_728;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_720;
  long local_718;
  long local_710;
  long local_708;
  long local_700;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6f8;
  long local_6f0;
  long local_6e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6d8;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  int *local_678;
  int local_66c;
  long local_668;
  int local_65c;
  undefined8 local_650;
  Real *local_648;
  undefined1 *local_640;
  undefined8 local_638;
  Real *local_630;
  undefined1 *local_628;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_620;
  undefined4 *local_618;
  undefined1 *local_610;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_608;
  undefined1 *local_600;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5f8;
  undefined1 *local_5f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5e8;
  undefined1 *local_5e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5d8;
  undefined1 *local_5d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c8;
  undefined1 *local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b8;
  undefined1 *local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a8;
  undefined1 *local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_598;
  undefined1 *local_590;
  long local_588;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_580;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_578;
  undefined1 *local_570;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_568;
  undefined1 *local_560;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  undefined1 *local_550;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_548;
  undefined1 *local_540;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_538;
  undefined1 *local_530;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  reference local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  reference local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  reference local_4b0;
  undefined1 *local_4a8;
  long local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  undefined4 *local_450;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_430;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  long local_418;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_410;
  long local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_400;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  long local_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  long local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  long local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  long local_360;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  long local_338;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  long local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  Real *local_2e8;
  Real *local_2e0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2d1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  undefined1 *local_2a0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_291;
  reference local_290;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  reference local_270;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  undefined1 *local_260;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_251;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  undefined1 *local_220;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_211;
  reference local_210;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  reference local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  undefined1 *local_1e0;
  undefined8 *local_1d8;
  long local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  long local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  long local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  long local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  long local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  long local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  long local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  long local_128;
  undefined8 *local_120;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_111;
  undefined8 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined8 *local_e0;
  long local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  int *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  int *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  int *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  int *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_620 = &local_6d8;
  local_678 = in_R8;
  local_66c = in_ECX;
  local_668 = in_RDX;
  local_65c = in_ESI;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffeed0);
  local_6f0 = *(long *)(in_RDI + 0x60);
  local_700 = *(long *)(in_RDI + 0x9c);
  local_708 = *(long *)(in_RDI + 0xa8);
  local_710 = *(long *)(in_RDI + 0xa6);
  local_718 = *(long *)(in_RDI + 0xa4);
  local_720 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x358597);
  local_728 = *(long *)(in_RDI + 0x8a);
  local_730 = *(long *)(in_RDI + 0x90);
  local_738 = *(long *)(in_RDI + 0x8e);
  local_740 = *(long *)(in_RDI + 0x8c);
  local_748 = *(long *)(in_RDI + 0x4c);
  local_750 = *(long *)(in_RDI + 0x4a);
  local_758 = *(long *)(in_RDI + 0x50);
  local_760 = *(long *)(in_RDI + 0x4e);
  local_618 = in_RDI + 0x11;
  local_610 = local_798;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  local_79c = in_RDI[1];
  local_680 = *(int *)(local_718 + (long)local_65c * 4);
  local_67c = *(int *)(local_710 + (long)local_65c * 4);
  in_RDI[2] = in_RDI[2] - local_67c;
  for (local_67c = local_680 + -1 + local_67c; local_680 <= local_67c; local_67c = local_67c + -1) {
    local_68c = *(int *)(local_700 + (long)local_67c * 4);
    local_684 = *(int *)(local_740 + (long)local_68c * 4);
    local_688 = *(int *)(local_738 + (long)local_68c * 4) + -1;
    *(int *)(local_738 + (long)local_68c * 4) = local_688;
    local_688 = local_688 + local_684;
    while (*(int *)(local_728 + (long)local_684 * 4) != local_65c) {
      local_684 = local_684 + 1;
    }
    *(undefined4 *)(local_728 + (long)local_684 * 4) =
         *(undefined4 *)(local_728 + (long)local_688 * 4);
    local_2f8 = local_720 + local_688;
    local_2f0 = local_720 + local_684;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  }
  if (local_66c == 0) {
    local_700 = *(long *)(in_RDI + 0x9c);
    local_6f8 = std::
                vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)0x358d61);
    local_684 = *(int *)(local_718 + (long)local_65c * 4);
    local_680 = local_684 + *(int *)(local_708 + (long)local_65c * 4);
    local_69c = 0;
    for (local_67c = 0; local_67c < local_79c; local_67c = local_67c + 1) {
      local_338 = local_668 + (long)local_67c * 0x38;
      local_330 = &local_6d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      local_908 = 0;
      local_140 = local_668 + (long)local_67c * 0x38;
      local_148 = &local_908;
      local_138 = local_148;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
      local_5d0 = local_940;
      local_5d8 = &local_6d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x358ebc);
      local_980 = Tolerances::epsilonUpdate(peVar4);
      local_628 = local_978;
      local_630 = &local_980;
      local_638 = 0;
      local_2e8 = local_630;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffeee0,(double)in_stack_ffffffffffffeed8,
                 in_stack_ffffffffffffeed0);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
      if (bVar2) {
        local_5c0 = local_9f0;
        local_5c8 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_ffffffffffffeec8);
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffeec8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x358fa3);
        if (tVar3) {
          local_5b0 = local_a60;
          local_5b8 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffeec8);
          local_470 = local_798;
          local_478 = local_a28;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        }
        if (local_680 <= local_684) {
          *(int *)(local_710 + (long)local_65c * 4) =
               local_684 - *(int *)(local_718 + (long)local_65c * 4);
          forestReMaxCol(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc,
                         in_stack_fffffffffffff0c8);
          local_700 = *(long *)(in_RDI + 0x9c);
          local_6f8 = std::
                      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)0x3590b0);
          local_684 = *(int *)(local_718 + (long)local_65c * 4);
          local_680 = local_684 + *(int *)(local_708 + (long)local_65c * 4);
          local_684 = *(int *)(local_710 + (long)local_65c * 4) + local_684;
        }
        local_340 = local_6f8 + local_684;
        local_348 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        iVar7 = local_684 + 1;
        *(int *)(local_700 + (long)local_684 * 4) = local_67c;
        local_684 = iVar7;
        if (*(int *)(local_730 + (long)local_67c * 4) <= *(int *)(local_738 + (long)local_67c * 4))
        {
          remaxRow(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8);
          local_720 = std::
                      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)0x3591e4);
          local_728 = *(long *)(in_RDI + 0x8a);
        }
        local_688 = *(int *)(local_740 + (long)local_67c * 4);
        iVar7 = *(int *)(local_738 + (long)local_67c * 4);
        *(int *)(local_738 + (long)local_67c * 4) = iVar7 + 1;
        local_688 = local_688 + iVar7;
        local_350 = local_720 + local_688;
        local_358 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        *(int *)(local_728 + (long)local_688 * 4) = local_65c;
        if (local_69c < *(int *)(local_748 + (long)local_67c * 4)) {
          local_69c = *(int *)(local_748 + (long)local_67c * 4);
        }
      }
    }
    iVar7 = local_684 - *(int *)(local_718 + (long)local_65c * 4);
    *(int *)(local_710 + (long)local_65c * 4) = iVar7;
    in_RDI[2] = iVar7 + in_RDI[2];
    if (*(int *)(local_718 + (long)local_65c * 4) + *(int *)(local_708 + (long)local_65c * 4) ==
        in_RDI[0x9b]) {
      in_RDI[0x9b] = in_RDI[0x9b] - *(int *)(local_708 + (long)local_65c * 4);
      *(undefined4 *)(local_708 + (long)local_65c * 4) =
           *(undefined4 *)(local_710 + (long)local_65c * 4);
      in_RDI[0x9b] = *(int *)(local_708 + (long)local_65c * 4) + in_RDI[0x9b];
    }
  }
  else {
    *(undefined4 *)(local_710 + (long)local_65c * 4) = 0;
    if (*(int *)(local_708 + (long)local_65c * 4) < local_66c) {
      forestReMaxCol(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc,in_stack_fffffffffffff0c8);
    }
    local_700 = *(long *)(in_RDI + 0x9c);
    local_6f8 = std::
                vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)0x358868);
    local_684 = *(int *)(local_718 + (long)local_65c * 4);
    local_69c = 0;
    for (local_680 = 0; local_680 < local_66c; local_680 = local_680 + 1) {
      local_67c = local_678[local_680];
      local_308 = local_668 + (long)local_67c * 0x38;
      local_300 = &local_6d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      local_7a8 = 0;
      local_128 = local_668 + (long)local_67c * 0x38;
      local_130 = &local_7a8;
      local_120 = local_130;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
      local_600 = local_7e0;
      local_608 = &local_6d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3589bc);
      local_820 = Tolerances::epsilonUpdate(peVar4);
      local_640 = local_818;
      local_648 = &local_820;
      local_650 = 0;
      local_2e0 = local_648;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffeee0,(double)in_stack_ffffffffffffeed8,
                 in_stack_ffffffffffffeed0);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffef40,in_stack_ffffffffffffef38);
      if (bVar2) {
        local_5f0 = local_890;
        local_5f8 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_ffffffffffffeec8);
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffeec8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x358aa3);
        if (tVar3) {
          local_5e0 = local_900;
          local_5e8 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffeec8);
          local_460 = local_798;
          local_468 = local_8c8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        }
        local_310 = local_6f8 + local_684;
        local_318 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        iVar7 = local_684 + 1;
        *(int *)(local_700 + (long)local_684 * 4) = local_67c;
        local_684 = iVar7;
        if (*(int *)(local_730 + (long)local_67c * 4) <= *(int *)(local_738 + (long)local_67c * 4))
        {
          remaxRow(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8);
          local_720 = std::
                      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)0x358bf8);
          local_728 = *(long *)(in_RDI + 0x8a);
        }
        local_688 = *(int *)(local_740 + (long)local_67c * 4);
        iVar7 = *(int *)(local_738 + (long)local_67c * 4);
        *(int *)(local_738 + (long)local_67c * 4) = iVar7 + 1;
        local_688 = local_688 + iVar7;
        local_320 = local_720 + local_688;
        local_328 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        *(int *)(local_728 + (long)local_688 * 4) = local_65c;
        if (local_69c < *(int *)(local_748 + (long)local_67c * 4)) {
          local_69c = *(int *)(local_748 + (long)local_67c * 4);
        }
      }
    }
    iVar7 = local_684 - *(int *)(local_718 + (long)local_65c * 4);
    *(int *)(local_710 + (long)local_65c * 4) = iVar7;
    in_RDI[2] = iVar7 + in_RDI[2];
  }
  local_698 = *(int *)(local_758 + (long)local_65c * 4);
  if (local_698 < local_69c) {
    local_680 = *(undefined4 *)(local_750 + (long)local_698 * 4);
    memmove((void *)(local_750 + (long)local_698 * 4),
            (void *)(local_750 + (long)(local_698 + 1) * 4),
            (ulong)(uint)(local_69c - local_698) << 2);
    *(int *)(local_750 + (long)local_69c * 4) = local_680;
    for (local_67c = local_698; local_67c <= local_69c; local_67c = local_67c + 1) {
      *(int *)(local_748 + (long)*(int *)(local_750 + (long)local_67c * 4) * 4) = local_67c;
    }
    local_680 = *(undefined4 *)(local_760 + (long)local_698 * 4);
    memmove((void *)(local_760 + (long)local_698 * 4),
            (void *)(local_760 + (long)(local_698 + 1) * 4),
            (ulong)(uint)(local_69c - local_698) << 2);
    *(int *)(local_760 + (long)local_69c * 4) = local_680;
    for (local_67c = local_698; local_67c <= local_69c; local_67c = local_67c + 1) {
      *(int *)(local_758 + (long)*(int *)(local_760 + (long)local_67c * 4) * 4) = local_67c;
    }
    local_6a0 = *(int *)(local_750 + (long)local_69c * 4);
    local_680 = *(int *)(local_740 + (long)local_6a0 * 4);
    local_67c = *(int *)(local_738 + (long)local_6a0 * 4);
    in_RDI[2] = in_RDI[2] - local_67c;
    if ((double)(local_79c - local_698) * 0.001 <= (double)local_67c) {
      for (local_67c = local_680 + -1 + local_67c; local_680 <= local_67c;
          local_67c = local_67c + -1) {
        local_684 = *(int *)(local_728 + (long)local_67c * 4);
        local_3d8 = local_720 + local_67c;
        local_3d0 = local_668 + (long)local_684 * 0x38;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        local_68c = *(int *)(local_710 + (long)local_684 * 4) + -1;
        *(int *)(local_710 + (long)local_684 * 4) = local_68c;
        local_68c = local_68c + *(int *)(local_718 + (long)local_684 * 4);
        local_688 = local_68c;
        while (*(int *)(local_700 + (long)local_688 * 4) != local_6a0) {
          local_688 = local_688 + -1;
        }
        *(undefined4 *)(local_700 + (long)local_688 * 4) =
             *(undefined4 *)(local_700 + (long)local_68c * 4);
        local_3e8 = local_6f8 + local_68c;
        local_3e0 = local_6f8 + local_688;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      }
      local_694 = makeLvec(in_stack_ffffffffffffeef0,(int)((ulong)in_stack_ffffffffffffeee8 >> 0x20)
                           ,(int)in_stack_ffffffffffffeee8);
      local_6e0 = std::
                  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          *)0x35a857);
      local_6e8 = *(long *)(in_RDI + 0x5a);
      for (local_67c = local_698; local_67c < local_69c; local_67c = local_67c + 1) {
        local_684 = *(int *)(local_760 + (long)local_67c * 4);
        local_db8 = 0;
        tVar3 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffeec8,(double *)0x35a8e2);
        if (tVar3) {
          local_690 = *(int *)(local_750 + (long)local_67c * 4);
          pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(local_668 + (long)local_684 * 0x38);
          local_290 = std::
                      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)(in_RDI + 0x74),(long)local_690);
          local_280 = local_df0;
          local_288 = pnVar5;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_291,pnVar5,local_290);
          local_278 = local_df0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0);
          local_260 = local_df0;
          local_268 = local_288;
          local_270 = local_290;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
                     (cpp_dec_float<50U,_int,_void> *)0x35a9e6);
          local_4d0 = &local_6d8;
          local_4d8 = local_df0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          *(int *)(local_6e8 + (long)local_694 * 4) = local_690;
          local_3f0 = local_6e0 + local_694;
          local_3f8 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          local_df8 = 0;
          local_1a0 = local_668 + (long)local_684 * 0x38;
          local_1a8 = &local_df8;
          local_198 = local_1a8;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
          local_694 = local_694 + 1;
          local_550 = local_e68;
          local_558 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffeec8);
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffeec8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x35ab4d);
          if (tVar3) {
            local_540 = local_ed8;
            local_548 = &local_6d8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
            spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffeec8);
            local_4e0 = local_798;
            local_4e8 = local_ea0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          }
          local_680 = *(int *)(local_740 + (long)local_690 * 4);
          local_68c = *(int *)(local_738 + (long)local_690 * 4) + local_680;
          for (; local_680 < local_68c; local_680 = local_680 + 1) {
            local_2d0 = local_720 + local_680;
            local_2c0 = local_f10;
            local_2c8 = &local_6d8;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_2d1,local_2c8,local_2d0);
            local_2b8 = local_f10;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_stack_ffffffffffffeed0);
            local_2a0 = local_f10;
            local_2a8 = local_2c8;
            local_2b0 = local_2d0;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
                       (cpp_dec_float<50U,_int,_void> *)0x35ace7);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffeef0,pnVar5);
          }
        }
      }
      if (*(int *)(local_6f0 + (long)(in_RDI[0x5e] + -1) * 4) == local_694) {
        in_RDI[0x5e] = in_RDI[0x5e] + -1;
      }
      else {
        *(int *)(local_6f0 + (long)(int)in_RDI[0x5e] * 4) = local_694;
      }
      local_684 = *(int *)(local_760 + (long)local_69c * 4);
      local_408 = local_668 + (long)local_684 * 0x38;
      local_400 = &local_6d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      tVar3 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffeec8,(double *)0x35ae1f);
      if (tVar3) {
        *in_RDI = 2;
        local_f3a = 1;
        uVar6 = __cxa_allocate_exception(0x28);
        paVar8 = &local_f39;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffff0c8,"XFORE02 The loaded matrix is singular",paVar8
                  );
        SPxStatusException::SPxStatusException
                  ((SPxStatusException *)in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8);
        local_f3a = 0;
        __cxa_throw(uVar6,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
      }
      local_f78 = 1;
      local_70 = local_f74;
      local_78 = &local_f78;
      local_80 = &local_6d8;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_81,local_80);
      local_68 = local_f74;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffeed0);
      local_50 = local_f74;
      local_60 = local_78;
      local_90 = (long)*local_78;
      local_58 = local_80;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffeed0,(longlong *)in_stack_ffffffffffffeec8,
                 (cpp_dec_float<50U,_int,_void> *)0x35afdc);
      local_4f0 = std::
                  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)(in_RDI + 0x74),(long)local_6a0);
      local_4f8 = local_f74;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      local_f80 = 0;
      local_1b8 = local_668 + (long)local_684 * 0x38;
      local_1c0 = &local_f80;
      local_1b0 = local_1c0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
      local_690 = 0;
      local_67c = local_69c;
      while (local_67c = local_67c + 1, local_67c < local_79c) {
        local_f88 = 0;
        tVar3 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffeec8,(double *)0x35b0ee);
        if (tVar3) {
          local_690 = local_690 + 1;
        }
      }
      if (*(int *)(local_730 + (long)local_6a0 * 4) < local_690) {
        *(undefined4 *)(local_738 + (long)local_6a0 * 4) = 0;
        remaxRow(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8);
        local_720 = std::
                    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            *)0x35b17a);
        local_728 = *(long *)(in_RDI + 0x8a);
      }
      in_RDI[2] = local_690 + in_RDI[2];
      local_690 = *(int *)(local_740 + (long)local_6a0 * 4);
      local_67c = local_69c;
      while (local_67c = local_67c + 1, local_67c < local_79c) {
        local_680 = *(int *)(local_760 + (long)local_67c * 4);
        local_418 = local_668 + (long)local_680 * 0x38;
        local_410 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        local_f90 = 0;
        tVar3 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffeec8,(double *)0x35b269);
        if (tVar3) {
          local_530 = local_1000;
          local_538 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffeec8);
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffeec8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x35b2d1);
          if (tVar3) {
            local_520 = local_1070;
            local_528 = &local_6d8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
            spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffeec8);
            local_500 = local_798;
            local_508 = local_1038;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          }
          *(int *)(local_728 + (long)local_690 * 4) = local_680;
          local_420 = local_720 + local_690;
          local_428 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          local_1078 = 0;
          local_1d0 = local_668 + (long)local_680 * 0x38;
          local_1d8 = &local_1078;
          local_1c8 = local_1d8;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
          local_690 = local_690 + 1;
          if (*(int *)(local_708 + (long)local_680 * 4) <= *(int *)(local_710 + (long)local_680 * 4)
             ) {
            forestReMaxCol(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc,
                           in_stack_fffffffffffff0c8);
            local_700 = *(long *)(in_RDI + 0x9c);
            local_6f8 = std::
                        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)0x35b4a0);
          }
          local_430 = local_6f8 +
                      (*(int *)(local_718 + (long)local_680 * 4) +
                      *(int *)(local_710 + (long)local_680 * 4));
          local_438 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          iVar7 = *(int *)(local_718 + (long)local_680 * 4);
          iVar1 = *(int *)(local_710 + (long)local_680 * 4);
          *(int *)(local_710 + (long)local_680 * 4) = iVar1 + 1;
          *(int *)(local_700 + (long)(iVar7 + iVar1) * 4) = local_6a0;
        }
      }
      *(int *)(local_738 + (long)local_6a0 * 4) =
           local_690 - *(int *)(local_740 + (long)local_6a0 * 4);
    }
    else {
      local_66c = 0;
      for (local_67c = local_680 + -1 + local_67c; local_680 <= local_67c;
          local_67c = local_67c + -1) {
        local_684 = *(int *)(local_728 + (long)local_67c * 4);
        local_368 = local_720 + local_67c;
        local_360 = local_668 + (long)local_684 * 0x38;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        enQueueMin(local_678,&local_66c,*(int *)(local_758 + (long)local_684 * 4));
        local_68c = *(int *)(local_710 + (long)local_684 * 4) + -1;
        *(int *)(local_710 + (long)local_684 * 4) = local_68c;
        local_68c = local_68c + *(int *)(local_718 + (long)local_684 * 4);
        local_688 = local_68c;
        while (*(int *)(local_700 + (long)local_688 * 4) != local_6a0) {
          local_688 = local_688 + -1;
        }
        *(undefined4 *)(local_700 + (long)local_688 * 4) =
             *(undefined4 *)(local_700 + (long)local_68c * 4);
        local_378 = local_6f8 + local_68c;
        local_370 = local_6f8 + local_688;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      }
      local_694 = makeLvec(in_stack_ffffffffffffeef0,(int)((ulong)in_stack_ffffffffffffeee8 >> 0x20)
                           ,(int)in_stack_ffffffffffffeee8);
      local_6e0 = std::
                  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          *)0x359834);
      local_6e8 = *(long *)(in_RDI + 0x5a);
      while ((local_66c != 0 &&
             (local_67c = deQueueMin(local_678,&local_66c), local_67c != local_69c))) {
        local_684 = *(int *)(local_760 + (long)local_67c * 4);
        local_690 = *(int *)(local_750 + (long)local_67c * 4);
        pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(local_668 + (long)local_684 * 0x38);
        local_210 = std::
                    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)(in_RDI + 0x74),(long)local_690);
        local_200 = local_a98;
        local_208 = pnVar5;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_211,pnVar5,local_210);
        local_1f8 = local_a98;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffeed0);
        local_1e0 = local_a98;
        local_1e8 = local_208;
        local_1f0 = local_210;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
                   (cpp_dec_float<50U,_int,_void> *)0x3599a7);
        local_480 = &local_6d8;
        local_488 = local_a98;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        *(int *)(local_6e8 + (long)local_694 * 4) = local_690;
        local_380 = local_6e0 + local_694;
        local_388 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        local_aa0 = 0;
        local_158 = local_668 + (long)local_684 * 0x38;
        local_160 = &local_aa0;
        local_150 = local_160;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
        local_694 = local_694 + 1;
        local_5a0 = local_b10;
        local_5a8 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_ffffffffffffeec8);
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffeec8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x359b0e);
        if (tVar3) {
          local_590 = local_b80;
          local_598 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffeec8);
          local_490 = local_798;
          local_498 = local_b48;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        }
        local_680 = *(int *)(local_740 + (long)local_690 * 4);
        local_68c = *(int *)(local_738 + (long)local_690 * 4) + local_680;
        for (; local_680 < local_68c; local_680 = local_680 + 1) {
          local_b84 = *(int *)(local_728 + (long)local_680 * 4);
          local_588 = local_668 + (long)local_b84 * 0x38;
          local_580 = &local_bbc;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          local_bc0 = 0;
          tVar3 = boost::multiprecision::operator==
                            (in_stack_ffffffffffffeed8,(int *)in_stack_ffffffffffffeed0);
          if (tVar3) {
            enQueueMin(local_678,&local_66c,*(int *)(local_758 + (long)local_b84 * 4));
          }
          local_250 = local_720 + local_680;
          local_240 = local_bf8;
          local_248 = &local_6d8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_251,local_248,local_250);
          local_238 = local_bf8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0);
          local_220 = local_bf8;
          local_228 = local_248;
          local_230 = local_250;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
                     (cpp_dec_float<50U,_int,_void> *)0x359d54);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
          local_c3c = 0;
          tVar3 = boost::multiprecision::operator==
                            (in_stack_ffffffffffffeed8,(int *)in_stack_ffffffffffffeed0);
          local_10f8 = 0x2b2bff2ee48e0530;
          if (!tVar3) {
            local_10f8 = 0;
          }
          local_c38 = local_10f8;
          local_100 = local_c30;
          local_108 = &local_bbc;
          local_110 = &local_c38;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_111,local_108);
          local_f8 = local_c30;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0);
          local_e8 = local_c30;
          local_f0 = local_108;
          local_e0 = local_110;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,(double *)0x359e6e);
          local_4a0 = local_668 + (long)local_b84 * 0x38;
          local_4a8 = local_c30;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        }
      }
      if (*(int *)(local_6f0 + (long)(in_RDI[0x5e] + -1) * 4) == local_694) {
        in_RDI[0x5e] = in_RDI[0x5e] + -1;
      }
      else {
        *(int *)(local_6f0 + (long)(int)in_RDI[0x5e] * 4) = local_694;
      }
      if (local_67c != local_69c) {
        *in_RDI = 2;
        local_c75 = 1;
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c60,"XFORE01 The loaded matrix is singular",&local_c61);
        SPxStatusException::SPxStatusException
                  ((SPxStatusException *)in_stack_ffffffffffffeed0,
                   (string *)in_stack_ffffffffffffeec8);
        local_c75 = 0;
        __cxa_throw(uVar6,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
      }
      local_684 = *(int *)(local_760 + (long)local_69c * 4);
      local_398 = local_668 + (long)local_684 * 0x38;
      local_390 = &local_6d8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      local_cb4 = 1;
      local_28 = local_cb0;
      local_30 = &local_cb4;
      local_38 = &local_6d8;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,local_38);
      local_20 = local_cb0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_ffffffffffffeed0);
      local_8 = local_cb0;
      local_18 = local_30;
      local_48 = (long)*local_30;
      local_10 = local_38;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_ffffffffffffeed0,(longlong *)in_stack_ffffffffffffeec8,
                 (cpp_dec_float<50U,_int,_void> *)0x35a14c);
      local_4b0 = std::
                  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)(in_RDI + 0x74),(long)local_6a0);
      local_4b8 = local_cb0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      local_cc0 = 0;
      local_170 = local_668 + (long)local_684 * 0x38;
      local_178 = &local_cc0;
      local_168 = local_178;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
      if (*(int *)(local_730 + (long)local_6a0 * 4) < local_66c) {
        *(undefined4 *)(local_738 + (long)local_6a0 * 4) = 0;
        remaxRow(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8);
        local_720 = std::
                    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            *)0x35a256);
        local_728 = *(long *)(in_RDI + 0x8a);
      }
      in_RDI[2] = local_66c + in_RDI[2];
      local_690 = *(int *)(local_740 + (long)local_6a0 * 4);
      for (local_67c = 0; local_67c < local_66c; local_67c = local_67c + 1) {
        local_680 = *(int *)(local_760 + (long)local_678[local_67c] * 4);
        local_3a8 = local_668 + (long)local_680 * 0x38;
        local_3a0 = &local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
        local_cc8 = 0;
        tVar3 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffeec8,(double *)0x35a34b);
        if (tVar3) {
          local_570 = local_d38;
          local_578 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffeec8);
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffeec8,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x35a3b3);
          if (tVar3) {
            local_560 = local_da8;
            local_568 = &local_6d8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
            spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffeec8);
            local_4c0 = local_798;
            local_4c8 = local_d70;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          }
          *(int *)(local_728 + (long)local_690 * 4) = local_680;
          local_3b0 = local_720 + local_690;
          local_3b8 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          local_db0 = 0;
          local_188 = local_668 + (long)local_680 * 0x38;
          local_190 = &local_db0;
          local_180 = local_190;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    (in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
          local_690 = local_690 + 1;
          if (*(int *)(local_708 + (long)local_680 * 4) <= *(int *)(local_710 + (long)local_680 * 4)
             ) {
            forestReMaxCol(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc,
                           in_stack_fffffffffffff0c8);
            local_700 = *(long *)(in_RDI + 0x9c);
            local_6f8 = std::
                        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)0x35a582);
          }
          local_3c0 = local_6f8 +
                      (*(int *)(local_718 + (long)local_680 * 4) +
                      *(int *)(local_710 + (long)local_680 * 4));
          local_3c8 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
          iVar7 = *(int *)(local_718 + (long)local_680 * 4);
          iVar1 = *(int *)(local_710 + (long)local_680 * 4);
          *(int *)(local_710 + (long)local_680 * 4) = iVar1 + 1;
          *(int *)(local_700 + (long)(iVar7 + iVar1) * 4) = local_6a0;
        }
      }
      *(int *)(local_738 + (long)local_6a0 * 4) =
           local_690 - *(int *)(local_740 + (long)local_6a0 * 4);
    }
  }
  else {
    if (local_69c != local_698) {
      *in_RDI = 2;
      m_00 = (string *)__cxa_allocate_exception(0x28);
      paVar8 = &local_10d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_10d8,"XFORE03 The loaded matrix is singular",paVar8);
      SPxStatusException::SPxStatusException((SPxStatusException *)paVar8,m_00);
      __cxa_throw(m_00,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
    }
    local_6a0 = *(int *)(local_750 + (long)local_69c * 4);
    local_67c = *(int *)(local_740 + (long)local_6a0 * 4);
    iVar7 = *(int *)(local_738 + (long)local_6a0 * 4) + -1;
    *(int *)(local_738 + (long)local_6a0 * 4) = iVar7;
    local_67c = local_67c + iVar7;
    local_10b4 = 1;
    local_c8 = local_720 + local_67c;
    local_b8 = &stack0xffffffffffffef50;
    local_c0 = &local_10b4;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_c9,local_c8);
    local_b0 = &stack0xffffffffffffef50;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_ffffffffffffeed0);
    local_98 = &stack0xffffffffffffef50;
    local_a8 = local_c0;
    local_d8 = (long)*local_c0;
    local_a0 = local_c8;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (in_stack_ffffffffffffeed0,(longlong *)in_stack_ffffffffffffeec8,
               (cpp_dec_float<50U,_int,_void> *)0x35b6df);
    local_510 = std::
                vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)(in_RDI + 0x74),(long)local_6a0);
    local_518 = &stack0xffffffffffffef50;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
    local_680 = *(int *)(local_710 + (long)local_65c * 4) + -1;
    *(int *)(local_710 + (long)local_65c * 4) = local_680;
    local_680 = local_680 + *(int *)(local_718 + (long)local_65c * 4);
    local_67c = local_680;
    while (*(int *)(local_700 + (long)local_67c * 4) != local_6a0) {
      local_67c = local_67c + -1;
    }
    *(undefined4 *)(local_700 + (long)local_67c * 4) =
         *(undefined4 *)(local_700 + (long)local_680 * 4);
    local_448 = local_6f8 + local_680;
    local_440 = local_6f8 + local_67c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  }
  local_450 = in_RDI + 0x11;
  local_458 = local_798;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  *in_RDI = 0;
  return;
}

Assistant:

void CLUFactor<R>::forestUpdate(int p_col, R* p_work, int num, int* nonz)
{
   int i, j, k, h, m, n;
   int ll, c, r, rowno;
   R x;

   R* lval;
   int* lidx;
   int* lbeg = l.start;

   R* cval;
   int* cidx = u.col.idx;
   int* cmax = u.col.max;
   int* clen = u.col.len;
   int* cbeg = u.col.start;

   R* rval = u.row.val.data();
   int* ridx = u.row.idx;
   int* rmax = u.row.max;
   int* rlen = u.row.len;
   int* rbeg = u.row.start;

   int* rperm = row.perm;
   int* rorig = row.orig;
   int* cperm = col.perm;
   int* corig = col.orig;

   R l_maxabs = maxabs;
   int dim = thedim;

   /*  Remove column p_col from U
    */
   j = cbeg[p_col];
   i = clen[p_col];
   nzCnt -= i;

   for(i += j - 1; i >= j; --i)
   {
      m = cidx[i];          // remove column p_col from row m
      k = rbeg[m];
      h = --(rlen[m]) + k;    // decrease length of row m

      while(ridx[k] != p_col)
         ++k;

      assert(k <= h);       // k is the position of p_col, h is last position

      ridx[k] = ridx[h];    // store last index at the position of p_col

      rval[k] = rval[h];
   }

   /*  Insert new VectorBase<R> column p_col thereby determining the highest permuted
    *       row index r.
    *
    *       Distinguish between optimized call (num > 0, nonz != 0) and
    *       non-optimized one.
    */
   assert(num);   // otherwise the assert( nonz != 0 ) below should fail

   if(num)
   {
      // Optimized call.
      assert(nonz != nullptr);

      clen[p_col] = 0;

      if(num > cmax[p_col])
         forestReMaxCol(p_col, num);

      cidx = u.col.idx;

      cval = u.col.val.data();

      k = cbeg[p_col];

      r = 0;

      for(j = 0; j < num; ++j)
      {
         i = nonz[j];
         x = p_work[i];
         p_work[i] = 0.0;

         if(isNotZero(x, R(_tolerances->epsilonUpdate())))
         {
            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            /* insert to column file */
            assert(k - cbeg[p_col] < cmax[p_col]);

            cval[k] = x;

            cidx[k++] = i;

            /* insert to row file */
            if(rmax[i] <= rlen[i])
            {
               remaxRow(i, rlen[i] + 1);
               rval = u.row.val.data();
               ridx = u.row.idx;
            }

            h = rbeg[i] + (rlen[i])++;

            rval[h] = x;
            ridx[h] = p_col;

            /* check permuted row index */

            if(rperm[i] > r)
               r = rperm[i];
         }
      }

      nzCnt += (clen[p_col] = k - cbeg[p_col]);
   }
   else
   {
      // Non-optimized call: We have to access all elements of p_work.
      assert(nonz == nullptr);

      /*
       *      clen[col] = 0;
       *      reMaxCol(fac, col, dim);
       */
      cidx = u.col.idx;
      cval = u.col.val.data();
      k = cbeg[p_col];
      j = k + cmax[p_col];
      r = 0;

      for(i = 0; i < dim; ++i)
      {
         x = p_work[i];
         p_work[i] = 0.0;

         if(isNotZero(x, R(_tolerances->epsilonUpdate())))
         {
            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            /* insert to column file */
            if(k >= j)
            {
               clen[p_col] = k - cbeg[p_col];
               forestReMaxCol(p_col, dim - i);
               cidx = u.col.idx;
               cval = u.col.val.data();
               k = cbeg[p_col];
               j = k + cmax[p_col];
               k += clen[p_col];
            }

            assert(k - cbeg[p_col] < cmax[p_col]);

            cval[k] = x;
            cidx[k++] = i;

            /* insert to row file */

            if(rmax[i] <= rlen[i])
            {
               remaxRow(i, rlen[i] + 1);
               rval = u.row.val.data();
               ridx = u.row.idx;
            }

            h = rbeg[i] + (rlen[i])++;

            rval[h] = x;
            ridx[h] = p_col;

            /* check permuted row index */

            if(rperm[i] > r)
               r = rperm[i];
         }
      }

      nzCnt += (clen[p_col] = k - cbeg[p_col]);

      if(cbeg[p_col] + cmax[p_col] == u.col.used)
      {
         u.col.used -= cmax[p_col];
         cmax[p_col] = clen[p_col];
         u.col.used += cmax[p_col];
      }
   }

   c = cperm[p_col];

   if(r > c)                          /* Forest Tomlin update */
   {
      /*      update permutations
       */
      j = rorig[c];

      // memmove is more efficient than a for loop
      // for ( i = c; i < r; ++i )
      //    rorig[i] = rorig[i + 1];
      memmove(&rorig[c], &rorig[c + 1], (unsigned int)(r - c) * sizeof(int));

      rorig[r] = j;

      for(i = c; i <= r; ++i)
         rperm[rorig[i]] = i;

      j = corig[c];

      // memmove is more efficient than a for loop
      // for ( i = c; i < r; ++i )
      //    corig[i] = corig[i + 1];
      memmove(&corig[c], &corig[c + 1], (unsigned int)(r - c) * sizeof(int));

      corig[r] = j;

      for(i = c; i <= r; ++i)
         cperm[corig[i]] = i;


      rowno = rorig[r];

      j = rbeg[rowno];

      i = rlen[rowno];

      nzCnt -= i;

      if(i < verySparseFactor * (dim - c))      // few nonzeros to be eliminated
      {
         /**
          *          The following assert is obviously violated if this method is called
          *          with nonzero==0.
          *
          *          @todo Use an extra member variable as a buffer for the heap instead of
          *                misusing nonz and num. The method enQueueMin() seems to
          *                sort the nonzeros or something, for which it only needs
          *                some empty VectorBase<R> of size num.
          */
         assert(nonz != nullptr);

         /*  move row r from U to p_work
          */
         num = 0;

         for(i += j - 1; i >= j; --i)
         {
            k = ridx[i];
            p_work[k] = rval[i];
            enQueueMin(nonz, &num, cperm[k]);
            m = --(clen[k]) + cbeg[k];

            for(h = m; cidx[h] != rowno; --h)
               ;

            cidx[h] = cidx[m];

            cval[h] = cval[m];
         }


         /*  Eliminate row r from U to L file
          */
         ll = makeLvec(r - c, rowno);

         lval = l.val.data();

         lidx = l.idx;

         assert((num == 0) || (nonz != nullptr));

         /* for(i = c; i < r; ++i)       */
         while(num)
         {
#ifndef NDEBUG
            // The numbers seem to be often 1e-100, is this ok ?

            for(i = 0; i < num; ++i)
               assert(p_work[corig[nonz[i]]] != 0.0);

#endif // NDEBUG
            i = deQueueMin(nonz, &num);

            if(i == r)
               break;

            k = corig[i];

            assert(p_work[k] != 0.0);

            n = rorig[i];

            x = p_work[k] * diag[n];

            lidx[ll] = n;

            lval[ll] = x;

            p_work[k] = 0.0;

            ll++;

            if(spxAbs(x) > l_maxabs)
               l_maxabs = spxAbs(x);

            j = rbeg[n];

            m = rlen[n] + j;

            for(; j < m; ++j)
            {
               int jj = ridx[j];
               R y = p_work[jj];

               if(y == 0)
                  enQueueMin(nonz, &num, cperm[jj]);

               y -= x * rval[j];

               p_work[jj] = y + ((y == 0) ? SOPLEX_FACTOR_MARKER : 0.0);
            }
         }

         if(lbeg[l.firstUnused - 1] == ll)
            (l.firstUnused)--;
         else
            lbeg[l.firstUnused] = ll;


         /*  Set diagonal value
          */
         if(i != r)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            throw SPxStatusException("XFORE01 The loaded matrix is singular");
         }

         k = corig[r];

         x = p_work[k];
         diag[rowno] = 1 / x;
         p_work[k] = 0.0;


         /*  make row large enough to fit all nonzeros.
          */

         if(rmax[rowno] < num)
         {
            rlen[rowno] = 0;
            remaxRow(rowno, num);
            rval = u.row.val.data();
            ridx = u.row.idx;
         }

         nzCnt += num;

         /*  Insert work to updated row thereby clearing work;
          */
         n = rbeg[rowno];

         for(i = 0; i < num; ++i)
         {
            j = corig[nonz[i]];
            x = p_work[j];

            // BH 2005-08-24: This if is very important. It may well happen that
            // during the elimination of row r a nonzero elements cancels out
            // and becomes zero. This would lead to an infinite loop in the
            // above elimination code, since the corresponding column index would
            // be enqueued for further elimination again and agian.

            if(x != 0.0)
            {
               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               ridx[n] = j;

               rval[n] = x;

               p_work[j] = 0.0;

               ++n;

               if(clen[j] >= cmax[j])
               {
                  forestReMaxCol(j, clen[j] + 1);
                  cidx = u.col.idx;
                  cval = u.col.val.data();
               }

               cval[cbeg[j] + clen[j]] = x;

               cidx[cbeg[j] + clen[j]++] = rowno;
            }
         }

         rlen[rowno] = n - rbeg[rowno];
      }
      else            /* few nonzeros to be eliminated        */
      {
         /*  move row r from U to p_work
          */
         for(i += j - 1; i >= j; --i)
         {
            k = ridx[i];
            p_work[k] = rval[i];
            m = --(clen[k]) + cbeg[k];

            for(h = m; cidx[h] != rowno; --h)
               ;

            cidx[h] = cidx[m];

            cval[h] = cval[m];
         }


         /*  Eliminate row r from U to L file
          */
         ll = makeLvec(r - c, rowno);

         lval = l.val.data();

         lidx = l.idx;

         for(i = c; i < r; ++i)
         {
            k = corig[i];

            if(p_work[k] != 0.0)
            {
               n = rorig[i];
               x = p_work[k] * diag[n];
               lidx[ll] = n;
               lval[ll] = x;
               p_work[k] = 0.0;
               ll++;

               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               j = rbeg[n];

               m = rlen[n] + j;

               for(; j < m; ++j)
                  p_work[ridx[j]] -= x * rval[j];
            }
         }

         if(lbeg[l.firstUnused - 1] == ll)
            (l.firstUnused)--;
         else
            lbeg[l.firstUnused] = ll;


         /*  Set diagonal value
          */
         k = corig[r];

         x = p_work[k];

         if(x == 0.0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            throw SPxStatusException("XFORE02 The loaded matrix is singular");
            //            return;
         }

         diag[rowno] = 1 / x;

         p_work[k] = 0.0;


         /*  count remaining nonzeros in work and make row large enough
          *  to fit them all.
          */
         n = 0;

         for(i = r + 1; i < dim; ++i)
            if(p_work[corig[i]] != 0.0)
               n++;

         if(rmax[rowno] < n)
         {
            rlen[rowno] = 0;
            remaxRow(rowno, n);
            rval = u.row.val.data();
            ridx = u.row.idx;
         }

         nzCnt += n;

         /*  Insert p_work to updated row thereby clearing p_work;
          */
         n = rbeg[rowno];

         for(i = r + 1; i < dim; ++i)
         {
            j = corig[i];
            x = p_work[j];

            if(x != 0.0)
            {
               if(spxAbs(x) > l_maxabs)
                  l_maxabs = spxAbs(x);

               ridx[n] = j;

               rval[n] = x;

               p_work[j] = 0.0;

               ++n;

               if(clen[j] >= cmax[j])
               {
                  forestReMaxCol(j, clen[j] + 1);
                  cidx = u.col.idx;
                  cval = u.col.val.data();
               }

               cval[cbeg[j] + clen[j]] = x;

               cidx[cbeg[j] + clen[j]++] = rowno;
            }
         }

         rlen[rowno] = n - rbeg[rowno];
      }
   }

   else if(r == c)
   {
      /*  Move diagonal element to diag.  Note, that it must be the last
       *  element, since it has just been inserted above.
       */
      rowno = rorig[r];
      i = rbeg[rowno] + --(rlen[rowno]);
      diag[rowno] = 1 / rval[i];

      for(j = i = --(clen[p_col]) + cbeg[p_col]; cidx[i] != rowno; --i)
         ;

      cidx[i] = cidx[j];

      cval[i] = cval[j];
   }
   else /* r < c */
   {
      this->stat = SLinSolver<R>::SINGULAR;
      throw SPxStatusException("XFORE03 The loaded matrix is singular");
      //      return;
   }

   maxabs = l_maxabs;

   assert(isConsistent());
   this->stat = SLinSolver<R>::OK;
}